

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall
Minisat::IntOption::fillGranularityDomain
          (IntOption *this,int granularity,vector<int,_std::allocator<int>_> *values)

{
  int *piVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  std::vector<int,_std::allocator<int>_>::resize(values,(long)granularity);
  iVar3 = this->value;
  piVar1 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *piVar1 = iVar3;
  iVar5 = 0x200;
  if (iVar3 < 16000) {
    iVar5 = 0x40;
  }
  iVar4 = 1;
  if (iVar3 < 0x10) {
    iVar5 = 1;
  }
  if (1 < granularity) {
    piVar1[1] = this->defaultValue;
    iVar4 = 2;
  }
  do {
    do {
      iVar3 = iVar5;
      if (granularity <= iVar4) goto LAB_00108543;
      if ((iVar3 != 0) && (iVar5 = this->value + iVar3, iVar5 <= (this->range).end)) {
        lVar6 = (long)iVar4;
        iVar4 = iVar4 + 1;
        piVar1[lVar6] = iVar5;
      }
      if ((iVar4 < granularity) && (iVar5 = this->value - iVar3, (this->range).begin <= iVar5)) {
        lVar6 = (long)iVar4;
        iVar4 = iVar4 + 1;
        piVar1[lVar6] = iVar5;
      }
      iVar5 = iVar3 * 4;
    } while (iVar3 < 1);
  } while ((this->value + iVar5 <= (this->range).end) ||
          ((this->range).begin <= this->value + iVar3 * -4));
LAB_00108543:
  std::vector<int,_std::allocator<int>_>::resize(values,(long)iVar4);
  sort<int,Minisat::LessThan_default<int>>(values);
  piVar2 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar3 = 0;
  for (lVar6 = 1; lVar6 < iVar4; lVar6 = lVar6 + 1) {
    iVar5 = iVar3;
    if (piVar2[lVar6] != piVar2[iVar3]) {
      iVar5 = iVar3 + 1;
      piVar2[(long)iVar3 + 1] = piVar2[lVar6];
    }
    iVar3 = iVar5;
  }
  std::vector<int,_std::allocator<int>_>::resize(values,(long)(iVar3 + 1));
  return;
}

Assistant:

void fillGranularityDomain(int granularity, std::vector<int> &values)
    {
        values.resize(granularity);
        int addedValues = 0;
        values[addedValues++] = value;
        int dist = value < 16 ? 1 : (value < 16000 ? 64 : 512); // smarter way to initialize the initial diff value
        if (addedValues < granularity) {
            values[addedValues++] = defaultValue;
        }
        while (addedValues < granularity) {
            if (value + dist > value && value + dist <= range.end) {
                values[addedValues++] = value + dist;
            }
            if (addedValues < granularity && value - dist >= range.begin) {
                values[addedValues++] = value - dist;
            }
            dist = dist * 4;
            if (value - dist < value && value + dist > range.end && value - dist < range.begin) {
                break;
            } // stop if there cannot be more values!
        }
        values.resize(addedValues);
        sort(values);
        int j = 0;
        assert(values[0] >= range.begin && values[0] <= range.end && "stay in bound");
        for (int i = 1; i < addedValues; ++i) {
            if (values[i] != values[j]) {
                assert(values[i] >= range.begin && values[i] <= range.end && "stay in bound");
                values[++j] = values[i];
            }
        }
        j++;
        assert(addedValues > 0 && "there has to be at least one option");
        assert(j <= addedValues && j <= granularity && "collected values hae to stay in bounds");
        values.resize(j);
    }